

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4-packet.cc
# Opt level: O3

void __thiscall Ipv4Packet::Print(Ipv4Packet *this,ostream *os)

{
  ostream *poVar1;
  char local_51;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Ipv4 Packet:",0xc);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"source ip: ",0xb);
  num2ip_abi_cxx11_(&local_50,this->sip);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                              local_50._M_dataplus._M_p._0_1_),
                      local_50._M_string_length);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_51,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
  }
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"destination ip: ",0x10);
  num2ip_abi_cxx11_(&local_50,this->dip);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                              local_50._M_dataplus._M_p._0_1_),
                      local_50._M_string_length);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_51,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
  }
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"total length: ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"identification: ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"flags: ",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"fragment offset: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"protocol: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void Ipv4Packet::Print(std::ostream& os)
{
    os << "Ipv4 Packet:" << '\n';
    os << '\t' << "source ip: " << num2ip(sip) << '\n';
    os << '\t' << "destination ip: " << num2ip(dip) << '\n';
    os << '\t' << "total length: " << tlen << '\n';
    os << '\t' << "identification: " << id << '\n';
    os << '\t' << "flags: " << flags << '\n';
    os << '\t' << "fragment offset: " << offset << '\n';
    os << '\t' << "protocol: " << (uint32_t)protocol << '\n';
    os << std::endl;
}